

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void dd_simplify_fname_c(char *s)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  size_t sVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  if (s != (char *)0x0) {
    sVar4 = strlen(s);
    iVar12 = (int)sVar4;
    iVar13 = 8;
    if (iVar12 < 8) {
      iVar13 = iVar12;
    }
    pvVar5 = memchr(s,0x3a,(long)iVar13);
    if (pvVar5 != (void *)0x0) {
      lVar6 = ((long)pvVar5 + 3) - (long)s;
      if (((lVar6 < iVar12) && (*(char *)((long)pvVar5 + 1) == '/')) &&
         (*(char *)((long)pvVar5 + 2) == '/')) {
        sVar4 = (size_t)(uint)(iVar12 - (int)lVar6);
        s = (char *)((long)pvVar5 + 3);
      }
    }
    if (0 < (int)sVar4) {
LAB_00175bc2:
      uVar8 = 0;
      do {
        if ((0x20 < (ulong)(byte)s[uVar8]) ||
           ((0x100002600U >> ((ulong)(byte)s[uVar8] & 0x3f) & 1) == 0)) goto LAB_00175be4;
        uVar8 = uVar8 + 1;
      } while ((sVar4 & 0xffffffff) != uVar8);
      uVar8 = sVar4 & 0xffffffff;
LAB_00175be4:
      iVar13 = (int)uVar8;
      if (iVar13 != 0) {
        uVar10 = (int)sVar4 - iVar13;
        sVar4 = (size_t)uVar10;
        memmove(s,s + (uVar8 & 0xffffffff),(long)(int)(uVar10 + 1));
      }
      if ((int)sVar4 < 1) {
        if (iVar13 == 0) {
          return;
        }
        goto LAB_00175cd2;
      }
      uVar10 = (int)sVar4 - 1;
      uVar8 = (ulong)uVar10;
      do {
        if ((0x20 < (ulong)(byte)s[uVar8]) ||
           ((0x100002600U >> ((ulong)(byte)s[uVar8] & 0x3f) & 1) == 0)) goto LAB_00175c37;
        bVar3 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar3);
      uVar8 = 0xffffffff;
LAB_00175c37:
      uVar9 = (uint)uVar8;
      if ((int)uVar9 < (int)uVar10) {
        s[(long)(int)uVar9 + 1] = '\0';
        sVar4 = (long)(int)uVar9 + 1;
      }
      uVar11 = (uint)sVar4;
      if (0 < (int)uVar11) {
        uVar8 = 0xffffffffffffffff;
        uVar7 = 0;
        do {
          if (s[uVar7] == '\"') {
            goto LAB_00175c82;
          }
          uVar7 = uVar7 + 1;
          uVar8 = uVar8 + 1;
        } while ((sVar4 & 0xffffffff) != uVar7);
      }
LAB_00175c6d:
      if ((int)uVar9 >= (int)uVar10 && iVar13 == 0) {
        if ((int)uVar11 < 2) {
          return;
        }
        uVar8 = 1;
        do {
          if (s[uVar8] == '\\') {
            s[uVar8] = '/';
          }
          uVar8 = uVar8 + 1;
        } while ((sVar4 & 0xffffffff) != uVar8);
        if (1 < (int)uVar11) {
          iVar13 = 1;
          do {
            iVar12 = iVar13;
            if ((s[iVar13] == '/') && (s[(long)iVar13 + -1] == '/')) {
              iVar12 = iVar13 + -1;
              memmove(s + iVar13,s + iVar13 + 1,(long)((int)sVar4 - iVar13));
              sVar4 = (size_t)((int)sVar4 - 1);
            }
            iVar13 = iVar12 + 1;
            uVar11 = (uint)sVar4;
          } while (iVar13 < (int)uVar11);
        }
        if ((int)uVar11 < 2) {
          return;
        }
        uVar8 = (ulong)uVar11;
        do {
          if ((*s != '.') || (s[1] != '/')) break;
          uVar7 = uVar8 - 2;
          memmove(s,s + 2,uVar8 - 1);
          bVar3 = 3 < (long)uVar8;
          uVar8 = uVar7;
        } while (bVar3);
        if ((int)uVar8 < 2) {
          return;
        }
        iVar13 = 1;
        do {
          iVar12 = iVar13;
          if (((s[iVar13] == '.') &&
              ((s[(long)iVar13 + -1] == ':' || (s[(long)iVar13 + -1] == '/')))) &&
             ((cVar2 = s[(long)iVar13 + 1], cVar2 == '/' || (cVar2 == '\0')))) {
            iVar12 = iVar13 + -1;
            uVar10 = (int)uVar8 + ~(uint)(cVar2 == '/');
            uVar8 = (ulong)uVar10;
            memmove(s + iVar13,s + iVar13 + (ulong)(cVar2 == '/') + 1,
                    (long)(int)((uVar10 - iVar13) + 1));
          }
          iVar13 = iVar12 + 1;
        } while (iVar13 < (int)uVar8);
        if ((int)uVar8 < 3) {
          return;
        }
        iVar13 = 2;
        do {
          if ((((s[(long)iVar13 + -2] == '/') && (s[(long)iVar13 + -1] == '.')) &&
              (s[iVar13] == '.')) &&
             ((cVar2 = s[(long)iVar13 + 1], cVar2 == '/' || (cVar2 == '\0')))) {
            uVar7 = (ulong)(iVar13 - 3U);
            if (2 < iVar13) {
              uVar7 = (ulong)(iVar13 - 3U);
              do {
                if ((s[uVar7] == '/') || (s[uVar7] == ':')) goto LAB_00175e5b;
                bVar3 = 0 < (long)uVar7;
                uVar7 = uVar7 - 1;
              } while (bVar3);
              uVar7 = 0xffffffff;
            }
LAB_00175e5b:
            iVar12 = (int)uVar7;
            lVar6 = (long)iVar12 + 1;
            iVar14 = (int)lVar6;
            if ((iVar14 < iVar13 + -2) &&
               (((iVar13 - iVar12 != 5 || (s[lVar6] != '.')) || (s[(long)iVar12 + 2] != '.')))) {
              iVar13 = (iVar13 - iVar12) + (uint)(cVar2 == '/');
              uVar10 = (int)uVar8 - iVar13;
              uVar8 = (ulong)uVar10;
              memmove(s + lVar6,s + lVar6 + iVar13,(long)(int)(uVar10 - iVar12));
              iVar13 = 1;
              if (1 < iVar14) {
                iVar13 = iVar14;
              }
            }
          }
          iVar13 = iVar13 + 1;
          if ((int)uVar8 <= iVar13) {
            return;
          }
        } while( true );
      }
      goto LAB_00175cd2;
    }
  }
  return;
  while (uVar1 = uVar8 + 1, lVar6 = uVar8 + 2, uVar8 = uVar1, s[lVar6] != '\"') {
LAB_00175c82:
    if ((sVar4 & 0xffffffff) <= uVar8 + 2) goto LAB_00175c6d;
  }
  memmove(s + uVar7,s + uVar7 + 1,(long)(int)(uVar11 - (int)uVar7));
  if ((int)uVar9 < (int)uVar10) {
    uVar10 = uVar9;
  }
  memmove(s + (uVar1 & 0xffffffff),s + (uVar1 & 0xffffffff) + 1,(long)(int)(uVar10 - (int)uVar1));
  sVar4 = (size_t)(uVar11 - 2);
LAB_00175cd2:
  if ((int)sVar4 < 1) {
    return;
  }
  goto LAB_00175bc2;
}

Assistant:

void dd_simplify_fname_c(char *s)
{
  if(!s) return;
  int i,len=strlen(s);

  // check for URL format to prevent removal of ://
  if (char *semi = (char*)memchr(s, ':', len > 8 ? 8 : len))
    if (len > (semi+3-s) && semi[1] == '/' && semi[2] == '/')
    {
      len -= int(semi+3-s);
      s = semi+3;
    }

  for(;;) {
    bool ok=false;
    // remove leading spaces
    for(i=0;i<len;++i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i>0) {len-=i;memmove(s,s+i,len+1); ok=true;}
    // remove trailing spaces
    for(i=len-1;i>=0;--i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i<len-1) {s[len=i+1]=0; ok=true;}
    // remove quotes
    for(i=0;i<len;++i) if(s[i]=='"') break;
    if(i<len) {
      int qs=i;
      for(++i;i<len;++i) if(s[i]=='"') break;
      if(i<len) {
        memmove(s+qs,s+qs+1,len-qs); --len; --i;
        memmove(s+i,s+i+1,len-i); --len;
        ok=true;
      }
    }
    if(!ok) break;
  }

  // replace all back slashes with normal ones
  for(i=1;i<len;++i)
    if(s[i]==PATH_DELIM_BACK )
      s[i]=PATH_DELIM;

  // remove extra slashes
  for(i=1;i<len;++i) if(s[i]==PATH_DELIM)
    if(s[i-1]==PATH_DELIM)
      {memmove(s+i,s+i+1,len-i); --len; --i;}

  // remove extra cur-dirs
  while (len>1)
    if (s[0]=='.' && s[1]==PATH_DELIM)
    {
      len-=2;
      memmove(s,s+2,len+1);
    }
    else
      break;

  for(i=1;i<len;++i) if(s[i]=='.' && (s[i-1]==PATH_DELIM || s[i-1]==':'))
    if(s[i+1]==PATH_DELIM || s[i+1]==0) {
      int e=1; if(s[i+1]==PATH_DELIM) ++e;
      len-=e; memmove(s+i,s+i+e,len+1-i);
      --i;
    }

  // remove extra up-dirs
  for (i=2; i<len; ++i) if (s[i-2]==PATH_DELIM && s[i-1]=='.' && s[i]=='.')
    if (s[i+1]==PATH_DELIM || s[i+1]==0)
    {
      int j;
      for (j=i-3;j>=0;--j) if(s[j]==PATH_DELIM || s[j]==':') break;

      if (++j<i-2)
      {
        int e=i+1-j;

        if (e!=5 || s[j]!='.' || s[j+1]!='.')
        {
          if (s[i+1]==PATH_DELIM) ++e;

          len-=e; memmove(s+j, s+j+e, len+1-j);
          i=std::max(j,1);
        }
      }
    }
}